

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QBspTree::Node>::copyAppend
          (QGenericArrayOps<QBspTree::Node> *this,Node *b,Node *e)

{
  Node *pNVar1;
  Node *in_RDX;
  Node *in_RSI;
  long in_RDI;
  Node *data;
  Node *local_10;
  
  if (in_RSI != in_RDX) {
    pNVar1 = QArrayDataPointer<QBspTree::Node>::begin((QArrayDataPointer<QBspTree::Node> *)0x8314e7)
    ;
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      pNVar1[*(long *)(in_RDI + 0x10)] = *local_10;
      local_10 = local_10 + 1;
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }